

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Hashing.h
# Opt level: O0

uint64_t llvm::hashing::detail::hash_33to64_bytes(char *s,size_t len,uint64_t seed)

{
  uint64_t uVar1;
  uint64_t uVar2;
  uint64_t uVar3;
  uint64_t uVar4;
  uint64_t uVar5;
  uint64_t uVar6;
  uint64_t uVar7;
  long lVar8;
  uint64_t uVar9;
  uint64_t uVar10;
  uint64_t r;
  uint64_t ws;
  uint64_t wf;
  uint64_t vs;
  uint64_t vf;
  uint64_t c;
  uint64_t b;
  uint64_t a;
  uint64_t z;
  uint64_t seed_local;
  size_t len_local;
  char *s_local;
  
  uVar1 = fetch64(s + 0x18);
  uVar2 = fetch64(s);
  uVar3 = fetch64(s + (len - 0x10));
  uVar2 = uVar2 + (len + uVar3) * -0x3c5a37a36834ced9;
  uVar3 = rotate(uVar2 + uVar1,0x34);
  uVar4 = rotate(uVar2,0x25);
  uVar5 = fetch64(s + 8);
  uVar6 = rotate(uVar5 + uVar2,7);
  uVar7 = fetch64(s + 0x10);
  uVar7 = uVar7 + uVar5 + uVar2;
  uVar2 = rotate(uVar7,0x1f);
  lVar8 = uVar3 + uVar2 + uVar6 + uVar4;
  uVar2 = fetch64(s + 0x10);
  uVar3 = fetch64(s + (len - 0x20));
  uVar2 = uVar2 + uVar3;
  uVar3 = fetch64(s + (len - 8));
  uVar4 = rotate(uVar2 + uVar3,0x34);
  uVar5 = rotate(uVar2,0x25);
  uVar6 = fetch64(s + (len - 0x18));
  uVar9 = rotate(uVar6 + uVar2,7);
  uVar10 = fetch64(s + (len - 0x10));
  uVar10 = uVar10 + uVar6 + uVar2;
  uVar2 = rotate(uVar10,0x1f);
  uVar1 = shift_mix((uVar7 + uVar1 + uVar4 + uVar2 + uVar9 + uVar5) * -0x651e95c4d06fbfb1 +
                    (uVar10 + uVar3 + lVar8) * -0x3c5a37a36834ced9);
  uVar1 = shift_mix((seed ^ uVar1 * -0x3c5a37a36834ced9) + lVar8);
  return uVar1 * -0x651e95c4d06fbfb1;
}

Assistant:

inline uint64_t hash_33to64_bytes(const char *s, size_t len, uint64_t seed) {
  uint64_t z = fetch64(s + 24);
  uint64_t a = fetch64(s) + (len + fetch64(s + len - 16)) * k0;
  uint64_t b = rotate(a + z, 52);
  uint64_t c = rotate(a, 37);
  a += fetch64(s + 8);
  c += rotate(a, 7);
  a += fetch64(s + 16);
  uint64_t vf = a + z;
  uint64_t vs = b + rotate(a, 31) + c;
  a = fetch64(s + 16) + fetch64(s + len - 32);
  z = fetch64(s + len - 8);
  b = rotate(a + z, 52);
  c = rotate(a, 37);
  a += fetch64(s + len - 24);
  c += rotate(a, 7);
  a += fetch64(s + len - 16);
  uint64_t wf = a + z;
  uint64_t ws = b + rotate(a, 31) + c;
  uint64_t r = shift_mix((vf + ws) * k2 + (wf + vs) * k0);
  return shift_mix((seed ^ (r * k0)) + vs) * k2;
}